

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

bool __thiscall CLI::App::_valid_subcommand(App *this,string *current,bool ignore_used)

{
  size_type sVar1;
  App *pAVar2;
  bool local_3a;
  bool local_39;
  App *com;
  bool ignore_used_local;
  string *current_local;
  App *this_local;
  
  if (((this->require_subcommand_max_ != 0) &&
      (sVar1 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size
                         (&this->parsed_subcommands_), this->require_subcommand_max_ <= sVar1)) &&
     ((this->subcommand_fallthrough_ & 1U) != 0)) {
    local_39 = false;
    if (this->parent_ != (App *)0x0) {
      local_39 = _valid_subcommand(this->parent_,current,ignore_used);
    }
    return local_39;
  }
  pAVar2 = _find_subcommand(this,current,true,ignore_used);
  if (pAVar2 == (App *)0x0) {
    if ((this->subcommand_fallthrough_ & 1U) == 0) {
      this_local._7_1_ = false;
    }
    else {
      local_3a = false;
      if (this->parent_ != (App *)0x0) {
        local_3a = _valid_subcommand(this->parent_,current,ignore_used);
      }
      this_local._7_1_ = local_3a;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool App::_valid_subcommand(const std::string &current, bool ignore_used) const {
    // Don't match if max has been reached - but still check parents
    if(require_subcommand_max_ != 0 && parsed_subcommands_.size() >= require_subcommand_max_ &&
       subcommand_fallthrough_) {
        return parent_ != nullptr && parent_->_valid_subcommand(current, ignore_used);
    }
    auto *com = _find_subcommand(current, true, ignore_used);
    if(com != nullptr) {
        return true;
    }
    // Check parent if exists, else return false
    if(subcommand_fallthrough_) {
        return parent_ != nullptr && parent_->_valid_subcommand(current, ignore_used);
    }
    return false;
}